

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O1

err_t cmdRngKbRead(tm_ticks_t *data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool_t on;
  bool_t bVar4;
  int iVar5;
  tm_ticks_t tVar6;
  tm_ticks_t tVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  tm_ticks_t local_58;
  err_t local_50;
  
  tVar6 = tmFreq();
  local_50 = 0xca;
  if (19999999 < tVar6) {
    puts("Collecting entropy from keyboard...");
    puts("Please, press different keys avoiding repetitions and long pauses:");
    lVar9 = -0x80;
    do {
      putchar(0x2a);
      lVar9 = lVar9 + 2;
    } while (lVar9 != 0);
    putchar(0xd);
    on = cmdTermEcho(0);
    local_58 = tmTicks();
    local_50 = 0;
    uVar10 = 0;
    iVar8 = 0;
    do {
      if (0x7f < uVar10) break;
      tVar7 = tmTicks();
      uVar2 = local_58 + tVar6 * 5;
      if (uVar2 < tVar7) {
        local_50 = 0x75;
      }
      else {
        bVar4 = cmdTermKbhit();
        if ((((bVar4 != 0) && (tVar6 / 0x14 + local_58 <= tVar7)) &&
            (iVar5 = cmdTermGetch(), iVar5 != iVar8)) && ((iVar5 != 0 && (iVar5 != 0xe0)))) {
          uVar1 = uVar10 + 1;
          data[uVar10] = tVar7 - local_58;
          uVar3 = uVar10 & 1;
          uVar10 = uVar1;
          iVar8 = iVar5;
          local_58 = tVar7;
          if (uVar3 == 0) {
            putchar(0x2e);
          }
        }
      }
    } while (tVar7 <= uVar2);
    cmdTermEcho(on);
    putchar(10);
  }
  return local_50;
}

Assistant:

err_t cmdRngKbRead(tm_ticks_t data[128])
{
	const tm_ticks_t freq = tmFreq(); /* число обновлений таймера в секунду */
	const tm_ticks_t max_delay = freq * 5; /* 5 с */
	const tm_ticks_t min_delay = freq / 20; /* 50 мс */
	register tm_ticks_t ticks;
	register tm_ticks_t t;
	err_t code;
	size_t pos;
	bool_t echo;
	int ch;
	// pre
	ASSERT(memIsValid(data, sizeof(tm_ticks_t) * 128));
	// таймер достаточно точен?
	code = freq >= 20000000u ? ERR_OK : ERR_FILE_NOT_FOUND;
	ERR_CALL_CHECK(code);
	// приглашение к сбору энтропии
	printf("Collecting entropy from keyboard...\n");
	printf("Please, press different keys avoiding repetitions and long pauses:\n");
	for (pos = 128; pos; pos -= 2)
		printf("%c", '*');
	printf("\r");
	// сбор энтропии
	echo = cmdTermEcho(FALSE);
	ASSERT(pos == 0);
	for (ticks = tmTicks(), ch = 0; pos < 128; )
	{
		int c;
		// превышен интервал ожидания?
		t = tmTicks();
		if (t > ticks + max_delay)
		{
			code = ERR_TIMEOUT;
			break;
		}
		// клавиша не нажата? нажата слишком быcтро?
		// нажали ту же клавишу? функциональную клавишу?
		if (!cmdTermKbhit() || t < ticks + min_delay ||
			(c = cmdTermGetch()) == ch || c == 0 || c == 0xE0)
			continue;
		// обрабатать нажатие
		data[pos++] = t - ticks, ticks = t, ch = c;
		if (pos % 2)
			printf(".");
	}
	ticks = t = 0;
	cmdTermEcho(echo);
	printf("\n");
	return code;
}